

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void __thiscall LogImpl::LogImpl(LogImpl *this)

{
  char *__s;
  int iVar1;
  StringConverter local_a0;
  string local_80;
  StringConverter local_60;
  RuntimeConfig local_40;
  undefined1 local_30 [8];
  ConfigSet config;
  LogImpl *this_local;
  
  cali::ConfigSet::ConfigSet(&this->m_config);
  std::ofstream::ofstream(&this->m_ofstream);
  __s = s_prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_prefix,__s,
             (allocator<char> *)
             ((long)&config.mP.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&config.mP.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 3));
  cali::RuntimeConfig::get_default_config();
  cali::RuntimeConfig::init((RuntimeConfig *)local_30,(EVP_PKEY_CTX *)&local_40);
  cali::RuntimeConfig::~RuntimeConfig(&local_40);
  cali::ConfigSet::get(&local_60,(ConfigSet *)local_30,"verbosity");
  iVar1 = cali::StringConverter::to_int(&local_60,(bool *)0x0);
  this->m_verbosity = iVar1;
  cali::StringConverter::~StringConverter(&local_60);
  cali::ConfigSet::get(&local_a0,(ConfigSet *)local_30,"logfile");
  cali::StringConverter::to_string_abi_cxx11_(&local_80,&local_a0,(bool *)0x0);
  init_stream(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  cali::StringConverter::~StringConverter(&local_a0);
  cali::ConfigSet::~ConfigSet((ConfigSet *)local_30);
  return;
}

Assistant:

LogImpl() : m_prefix { s_prefix }
    {
        ConfigSet config = RuntimeConfig::get_default_config().init("log", s_configdata);

        m_verbosity = config.get("verbosity").to_int();
        init_stream(config.get("logfile").to_string());
    }